

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O2

bool __thiscall ON_SectionStyle::Read(ON_SectionStyle *this,ON_BinaryArchive *file)

{
  bool bVar1;
  SectionFillRule rule;
  SectionBackgroundFillMode mode;
  byte bVar2;
  uchar item_id;
  int major_version;
  uint model_component_attributes_filter;
  int minor_version;
  uchar c;
  undefined7 uStack_cf;
  
  ON_SectionStyle((ON_SectionStyle *)&c);
  operator=(this,(ON_SectionStyle *)&c);
  ~ON_SectionStyle((ON_SectionStyle *)&c);
  major_version = 0;
  minor_version = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&major_version,&minor_version);
  if (!bVar1) {
    return false;
  }
  if (major_version == 1) {
    model_component_attributes_filter = 0;
    bVar1 = ON_BinaryArchive::ReadModelComponentAttributes
                      (file,&this->super_ON_ModelComponent,&model_component_attributes_filter);
    if (bVar1) {
      item_id = '\0';
      bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
      if (bVar1) {
        if (item_id == '\x01') {
          _c = (_func_int **)((ulong)_c & 0xffffffffffffff00);
          bVar1 = ON_BinaryArchive::ReadChar(file,&c);
          if (!bVar1) goto LAB_005b7285;
          mode = (c == '\x02') + Viewport;
          bVar2 = 0;
          if (c == '\0') {
            mode = None;
          }
          SetBackgroundFillMode(this,mode);
          bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
          if (!bVar1) goto LAB_005b7287;
        }
        if (item_id == '\x02') {
          _c = (_func_int **)CONCAT44(uStack_cf._3_4_,ON_Color::UnsetColor.field_0);
          bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&c);
          if (bVar1) {
            SetBackgroundFillColor(this,(ON_Color *)&c,false);
            bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&c);
            if (bVar1) {
              SetBackgroundFillColor(this,(ON_Color *)&c,true);
              bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
              if (bVar1) goto LAB_005b6f99;
            }
          }
        }
        else {
LAB_005b6f99:
          if (item_id == '\x03') {
            _c = (_func_int **)CONCAT71(uStack_cf,1);
            bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)&c);
            if (bVar1) {
              SetBoundaryVisible(this,(bool)c);
              bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
              if (bVar1) goto LAB_005b6fdb;
            }
          }
          else {
LAB_005b6fdb:
            if (item_id == '\x04') {
              _c = (_func_int **)CONCAT44(uStack_cf._3_4_,ON_Color::UnsetColor.field_0);
              bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&c);
              if (bVar1) {
                SetBoundaryColor(this,(ON_Color *)&c,false);
                bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&c);
                if (bVar1) {
                  SetBoundaryColor(this,(ON_Color *)&c,true);
                  bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
                  if (bVar1) goto LAB_005b704d;
                }
              }
            }
            else {
LAB_005b704d:
              if (item_id == '\x05') {
                _c = (_func_int **)0x3ff0000000000000;
                bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&c);
                if (bVar1) {
                  SetBoundaryWidthScale(this,(double)_c);
                  bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
                  if (bVar1) goto LAB_005b709a;
                }
              }
              else {
LAB_005b709a:
                if (item_id == '\x06') {
                  _c = (_func_int **)((ulong)_c & 0xffffffffffffff00);
                  bVar1 = ON_BinaryArchive::ReadChar(file,&c);
                  if (bVar1) {
                    rule = ON::SectionFillRuleFromUnsigned((uint)c);
                    SetSectionFillRule(this,rule);
                    bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
                    if (bVar1) goto LAB_005b70e4;
                  }
                }
                else {
LAB_005b70e4:
                  if (item_id == '\a') {
                    _c = (_func_int **)((ulong)_c & 0xffffffff00000000);
                    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&c);
                    if (bVar1) {
                      SetHatchIndex(this,(int)_c);
                      bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
                      if (bVar1) goto LAB_005b7125;
                    }
                  }
                  else {
LAB_005b7125:
                    if (item_id == '\b') {
                      _c = (_func_int **)0x3ff0000000000000;
                      bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&c);
                      if (bVar1) {
                        SetHatchScale(this,(double)_c);
                        bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
                        if (bVar1) goto LAB_005b7168;
                      }
                    }
                    else {
LAB_005b7168:
                      if (item_id == '\t') {
                        _c = (_func_int **)0x0;
                        bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&c);
                        if (bVar1) {
                          SetHatchRotation(this,(double)_c);
                          bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
                          if (bVar1) goto LAB_005b71ac;
                        }
                      }
                      else {
LAB_005b71ac:
                        if (item_id == '\n') {
                          _c = (_func_int **)CONCAT44(uStack_cf._3_4_,ON_Color::UnsetColor.field_0);
                          bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&c);
                          if (bVar1) {
                            SetHatchColor(this,(ON_Color *)&c,false);
                            bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&c);
                            if (bVar1) {
                              SetHatchColor(this,(ON_Color *)&c,true);
                              bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
                              if (bVar1) goto LAB_005b721a;
                            }
                          }
                        }
                        else {
LAB_005b721a:
                          if (item_id != '\v') {
LAB_005b7269:
                            bVar2 = 1;
                            if (0xb < item_id) {
                              item_id = '\0';
                            }
                            goto LAB_005b7287;
                          }
                          ON_Linetype::ON_Linetype((ON_Linetype *)&c);
                          bVar1 = ON_Linetype::Read((ON_Linetype *)&c,file);
                          if (bVar1) {
                            SetBoundaryLinetype(this,(ON_Linetype *)&c);
                            bVar1 = ON_BinaryArchive::ReadChar(file,&item_id);
                            ON_Linetype::~ON_Linetype((ON_Linetype *)&c);
                            if (bVar1) goto LAB_005b7269;
                          }
                          else {
                            ON_Linetype::~ON_Linetype((ON_Linetype *)&c);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_005b7285:
  bVar2 = 0;
LAB_005b7287:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_SectionStyle::Read( ON_BinaryArchive& file)
{
  *this = ON_SectionStyle();

  int major_version=0;
  int minor_version=0;
  if (!file.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version ))
    return false;

  bool rc = false;

  if ( 1 == major_version )
  {
    for (;;)
    {
      // chunk version 1.0 fields
      unsigned int model_component_attributes_filter = 0;
      if (!file.ReadModelComponentAttributes(*this,&model_component_attributes_filter))
        break;

      unsigned char item_id = 0;
      if (!file.ReadChar(&item_id))
        break;

      if (ON_SectionStyleTypeCodes::BackgroundFillMode == item_id) // 1
      {
        unsigned char c = 0;
        if (!file.ReadChar(&c))
          break;

        SectionBackgroundFillMode mode = SectionBackgroundFillModeFromUnsigned(c);
        SetBackgroundFillMode(mode);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BackgroundFillColor == item_id) // 2
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetBackgroundFillColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetBackgroundFillColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryVisible == item_id) // 3
      {
        bool b = true;
        if (!file.ReadBool(&b))
          break;
        SetBoundaryVisible(b);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryColor == item_id) // 4
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetBoundaryColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetBoundaryColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryWidthScale == item_id) // 5
      {
        double scale = 1.0;
        if (!file.ReadDouble(&scale))
          break;
        SetBoundaryWidthScale(scale);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::SectionFillRule == item_id) // 6
      {
        unsigned char rule = 0;
        if (!file.ReadChar(&rule))
          break;
        SetSectionFillRule(ON::SectionFillRuleFromUnsigned(rule));
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchIndex == item_id) // 7
      {
        int index = 0;
        if (!file.ReadInt(&index))
          break;
        SetHatchIndex(index);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchScale == item_id) // 8
      {
        double scale = 1.0;
        if (!file.ReadDouble(&scale))
          break;
        SetHatchScale(scale);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchRotation == item_id) // 9
      {
        double rotation = 0;
        if (!file.ReadDouble(&rotation))
          break;
        SetHatchRotation(rotation);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchColor == item_id) // 10
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetHatchColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetHatchColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryLinetype == item_id) // 11
      {
        ON_Linetype lt;
        if(!lt.Read(file))
          break;
        SetBoundaryLinetype(lt);
        if (!file.ReadChar(&item_id))
          break;
      }

      if (item_id > ON_SectionStyleTypeCodes::LastSectionStyleTypeCode)
      {
        // we are reading file written with code newer
        // than this code (minor_version > 0)
        item_id = 0;
      }

      rc = true;
      break;
    }
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}